

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

cmpresult_t uECC_vli_cmp(uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  uECC_word_t uVar1;
  uECC_word_t uVar2;
  uECC_word_t equal;
  uECC_word_t neg;
  uECC_word_t tmp [4];
  wordcount_t num_words_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  
  uVar1 = uECC_vli_sub(&neg,left,right,num_words);
  uVar2 = uECC_vli_isZero(&neg,num_words);
  return ((uVar2 != 0 ^ 0xffU) & 1) + (uVar1 != 0) * -2;
}

Assistant:

uECC_VLI_API cmpresult_t uECC_vli_cmp(const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t neg = !!uECC_vli_sub(tmp, left, right, num_words);
    uECC_word_t equal = uECC_vli_isZero(tmp, num_words);
    return (!equal - 2 * neg);
}